

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::PushExpr
          (WatWriter *this,Expr *expr,Index operand_count,Index result_count)

{
  undefined8 *puVar1;
  pointer pEVar2;
  Expr *__result;
  pointer pEVar3;
  _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *p_Var4;
  pointer pEVar5;
  pointer pEVar6;
  pointer pEVar7;
  pointer pEVar8;
  pointer pEVar9;
  undefined4 in_register_0000000c;
  pointer __alloc;
  undefined4 in_register_00000014;
  char *__s;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  pointer *ppEVar10;
  long lVar11;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *this_00;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  local_b8;
  pointer local_98;
  undefined1 local_90 [8];
  ExprTree tree;
  Expr *local_40;
  
  __s = (char *)CONCAT44(in_register_00000014,operand_count);
  pEVar9 = (pointer)CONCAT44(in_register_0000000c,result_count);
  pEVar6 = (pointer)(ulong)operand_count;
  this_00 = &this->expr_tree_stack_;
  pEVar7 = (this->expr_tree_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar6 <= (pointer)((long)pEVar7 -
                          (long)(this->expr_tree_stack_).
                                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    tree.children.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)pEVar6 * 0x20);
    local_98 = pEVar7 + -(long)pEVar6;
    tree.expr = (Expr *)0x0;
    tree.children.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tree.children.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppEVar10 = &(local_98->children).
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_40 = (Expr *)0x0;
    pEVar5 = (pointer)0x0;
    local_90 = (undefined1  [8])expr;
    for (; pEVar8 = tree.children.
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_start, 0 < (long)pEVar6;
        pEVar6 = (pointer)((long)&pEVar6[-1].children.
                                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
      if (tree.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_start == pEVar5) {
        pEVar3 = pEVar6;
        p_Var4 = (_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  *)std::
                    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ::_M_check_len((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                    *)&tree,(size_type)pEVar6,__s);
        __result = (Expr *)std::
                           _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                           ::_M_allocate(p_Var4,(size_t)pEVar3);
        pEVar2 = ((_Vector_impl_data *)(ppEVar10 + -1))->_M_start;
        puVar1 = (undefined8 *)((long)__result + ((long)pEVar5 - (long)local_40));
        *puVar1 = ppEVar10[-2];
        puVar1[1] = pEVar2;
        pEVar2 = ppEVar10[1];
        puVar1 = (undefined8 *)((long)__result + ((long)pEVar5 - (long)local_40) + 0x10);
        *puVar1 = *ppEVar10;
        puVar1[1] = pEVar2;
        ((_Vector_impl_data *)(ppEVar10 + -1))->_M_start = (pointer)0x0;
        *ppEVar10 = (pointer)0x0;
        ppEVar10[1] = (pointer)0x0;
        pEVar3 = std::
                 vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 ::_S_relocate((pointer)local_40,pEVar8,(pointer)__result,(_Tp_alloc_type *)pEVar9);
        pEVar3 = std::
                 vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 ::_S_relocate(pEVar8,pEVar8,pEVar3 + 1,(_Tp_alloc_type *)pEVar9);
        __s = extraout_RDX;
        if (local_40 != (Expr *)0x0) {
          operator_delete(local_40);
          __s = extraout_RDX_00;
        }
        pEVar5 = (pointer)(&__result->_vptr_Expr + (long)p_Var4 * 4);
        tree.expr = __result;
        tree.children.
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_finish = pEVar5;
        local_40 = __result;
      }
      else {
        pEVar8 = ((_Vector_impl_data *)(ppEVar10 + -1))->_M_start;
        (tree.children.
         super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ._M_impl.super__Vector_impl_data._M_start)->expr = (Expr *)ppEVar10[-2];
        ((tree.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_start)->children).
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_start = pEVar8;
        pEVar8 = ppEVar10[1];
        ((tree.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_start)->children).
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_finish = *ppEVar10;
        ((tree.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_start)->children).
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar8;
        ppEVar10[1] = (pointer)0x0;
        ((_Vector_impl_data *)(ppEVar10 + -1))->_M_start = (pointer)0x0;
        *ppEVar10 = (pointer)0x0;
        pEVar3 = tree.children.
                 super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      ppEVar10 = ppEVar10 + 4;
      tree.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start = pEVar3;
    }
    pEVar5 = (this->expr_tree_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (operand_count != 0) {
      pEVar9 = pEVar7;
      if ((long)pEVar5 - (long)pEVar7 != 0) {
        ppEVar10 = &(pEVar7->children).
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        tree.children.
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)-(long)tree.children.
                             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        for (lVar11 = (long)pEVar5 - (long)pEVar7 >> 5; 0 < lVar11; lVar11 = lVar11 + -1) {
          local_b8.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               *(pointer *)
                ((long)(ppEVar10 + 1) +
                (long)tree.children.
                      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pEVar5 = ((_Vector_impl_data *)(ppEVar10 + -1))->_M_start;
          puVar1 = (undefined8 *)
                   ((long)&(tree.children.
                            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->expr +
                   (long)&((_Vector_impl_data *)(ppEVar10 + -1))->_M_start);
          local_b8.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
          local_b8.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
          *(undefined8 *)
           ((long)(ppEVar10 + -2) +
           (long)tree.children.
                 super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) = ppEVar10[-2];
          ((undefined8 *)
          ((long)(ppEVar10 + -2) +
          (long)tree.children.
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage))[1] = pEVar5;
          pEVar5 = ppEVar10[1];
          *(undefined8 *)
           ((long)ppEVar10 +
           (long)tree.children.
                 super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) = *ppEVar10;
          ((undefined8 *)
          ((long)ppEVar10 +
          (long)tree.children.
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage))[1] = pEVar5;
          ((_Vector_impl_data *)(ppEVar10 + -1))->_M_start = (pointer)0x0;
          *ppEVar10 = (pointer)0x0;
          ppEVar10[1] = (pointer)0x0;
          std::
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ::~vector(&local_b8);
          ppEVar10 = ppEVar10 + 4;
        }
        pEVar9 = (this->expr_tree_stack_).
                 super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pEVar6 = (pointer)((long)local_98 + ((long)pEVar9 - (long)pEVar7));
      std::
      vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ::_M_erase_at_end(this_00,pEVar6);
      pEVar5 = (this->expr_tree_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pEVar9 = pEVar7;
      __s = extraout_RDX_01;
    }
    if (pEVar5 == (this->expr_tree_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      p_Var4 = (_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                *)std::
                  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ::_M_check_len(this_00,(size_type)pEVar6,__s);
      pEVar7 = (this->expr_tree_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar3 = (this->expr_tree_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pEVar8 = std::
               _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ::_M_allocate(p_Var4,(size_t)pEVar6);
      ExprTree::ExprTree((ExprTree *)(((long)pEVar5 - (long)pEVar7) + (long)pEVar8),
                         (ExprTree *)local_90);
      pEVar6 = std::
               vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ::_S_relocate(pEVar7,pEVar5,pEVar8,(_Tp_alloc_type *)pEVar9);
      pEVar9 = std::
               vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ::_S_relocate(pEVar5,pEVar3,pEVar6 + 1,(_Tp_alloc_type *)pEVar9);
      if (pEVar7 != (pointer)0x0) {
        operator_delete(pEVar7);
      }
      (this->expr_tree_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start = pEVar8;
      (this->expr_tree_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar9;
      (this->expr_tree_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar8 + (long)p_Var4;
    }
    else {
      ExprTree::ExprTree(pEVar5,(ExprTree *)local_90);
      ppEVar10 = &(this->expr_tree_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppEVar10 = *ppEVar10 + 1;
    }
    if (result_count == 0) {
      FlushExprTreeStack(this);
    }
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::~vector((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               *)&tree);
    return;
  }
  if (pEVar7 == (this->expr_tree_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    p_Var4 = (_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
              *)std::
                vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ::_M_check_len(this_00,(size_type)pEVar6,__s);
    pEVar9 = (this->expr_tree_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar3 = (this->expr_tree_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar11 = (long)pEVar7 - (long)pEVar9;
    __alloc = pEVar3;
    pEVar5 = std::
             _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ::_M_allocate(p_Var4,(size_t)pEVar6);
    *(Expr **)((long)pEVar5 + lVar11) = expr;
    puVar1 = (undefined8 *)((long)pEVar5 + lVar11 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)pEVar5 + lVar11 + 0x18) = 0;
    pEVar6 = std::
             vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ::_S_relocate(pEVar9,pEVar7,pEVar5,(_Tp_alloc_type *)__alloc);
    pEVar7 = std::
             vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ::_S_relocate(pEVar7,pEVar3,pEVar6 + 1,(_Tp_alloc_type *)__alloc);
    if (pEVar9 != (pointer)0x0) {
      operator_delete(pEVar9);
    }
    (this->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start = pEVar5;
    (this->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar7;
    (this->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar5 + (long)p_Var4;
  }
  else {
    pEVar7->expr = expr;
    (pEVar7->children).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pEVar7->children).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pEVar7->children).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppEVar10 = &(this->expr_tree_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppEVar10 = *ppEVar10 + 1;
  }
  FlushExprTreeStack(this);
  return;
}

Assistant:

void WatWriter::PushExpr(const Expr* expr,
                         Index operand_count,
                         Index result_count) {
  WABT_TRACE_ARGS(PushExpr, "%s, %" PRIindex ", %" PRIindex "",
                  GetExprTypeName(*expr), operand_count, result_count);
  if (operand_count <= expr_tree_stack_.size()) {
    auto last_operand = expr_tree_stack_.end();
    auto first_operand = last_operand - operand_count;
    ExprTree tree(expr);
    std::move(first_operand, last_operand, std::back_inserter(tree.children));
    expr_tree_stack_.erase(first_operand, last_operand);
    expr_tree_stack_.emplace_back(tree);
    if (result_count == 0) {
      FlushExprTreeStack();
    }
  } else {
    expr_tree_stack_.emplace_back(expr);
    FlushExprTreeStack();
  }
}